

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O0

bool wallet::feebumper::TransactionCanBeBumped(CWallet *wallet,uint256 *txid)

{
  long lVar1;
  Result RVar2;
  CWalletTx *pCVar3;
  long in_FS_OFFSET;
  Result res;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_00000038;
  bool in_stack_00000047;
  CWalletTx *wtx;
  vector<bilingual_str,_std::allocator<bilingual_str>_> errors_dummy;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  CWallet *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8b;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffa8;
  undefined1 local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(bool)in_stack_ffffffffffffff8b);
  pCVar3 = CWallet::GetWalletTx
                     (in_stack_ffffffffffffff80,
                      (uint256 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (pCVar3 == (CWalletTx *)0x0) {
    local_31 = false;
  }
  else {
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffff68);
    RVar2 = PreconditionChecks((CWallet *)txid,wtx,in_stack_00000047,in_stack_00000038);
    local_31 = RVar2 == OK;
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool TransactionCanBeBumped(const CWallet& wallet, const uint256& txid)
{
    LOCK(wallet.cs_wallet);
    const CWalletTx* wtx = wallet.GetWalletTx(txid);
    if (wtx == nullptr) return false;

    std::vector<bilingual_str> errors_dummy;
    feebumper::Result res = PreconditionChecks(wallet, *wtx, /* require_mine=*/ true, errors_dummy);
    return res == feebumper::Result::OK;
}